

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::ComputeOutputDir
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *out)

{
  TargetType TVar1;
  size_type sVar2;
  cmGlobalGenerator *pcVar3;
  cmMakefile *pcVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  string conf;
  string configPropStr;
  string propertyNameStr;
  string targetTypeName;
  string configUpper;
  auto_ptr<cmCompiledGeneratorExpression> local_118;
  string local_110;
  undefined1 local_f0 [32];
  string local_d0;
  pointer local_b0;
  long local_a8;
  char *local_90;
  long local_88;
  string local_70 [32];
  string local_50;
  
  std::__cxx11::string::string((string *)&local_d0,(string *)config);
  pcVar7 = GetOutputTargetType(this,artifact);
  std::__cxx11::string::string(local_70,pcVar7,(allocator *)&local_90);
  std::__cxx11::string::string((string *)&local_90,local_70);
  if (local_88 == 0) {
    pcVar7 = (char *)0x0;
  }
  else {
    std::__cxx11::string::append((char *)&local_90);
    pcVar7 = local_90;
  }
  cmsys::SystemTools::UpperCase(&local_50,&local_d0);
  std::__cxx11::string::string((string *)&local_b0,local_70);
  if (local_a8 == 0) {
    local_b0 = (pointer)0x0;
  }
  else {
    std::__cxx11::string::append((char *)&local_b0);
    std::__cxx11::string::append((string *)&local_b0);
  }
  std::__cxx11::string::string((string *)&local_110,(char *)local_b0,(allocator *)local_f0);
  pcVar8 = GetProperty(this,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  if (pcVar8 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_110,pcVar7,(allocator *)local_f0);
    pcVar7 = GetProperty(this,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    if (pcVar7 == (char *)0x0) {
      TVar1 = this->Target->TargetTypeValue;
      if (TVar1 - STATIC_LIBRARY < 3) {
        pcVar4 = this->Makefile;
        std::__cxx11::string::string
                  ((string *)&local_110,"LIBRARY_OUTPUT_PATH",(allocator *)local_f0);
        cmMakefile::GetSafeDefinition(pcVar4,&local_110);
        std::__cxx11::string::assign((char *)out);
      }
      else {
        if (TVar1 != EXECUTABLE) goto LAB_0039758c;
        pcVar4 = this->Makefile;
        std::__cxx11::string::string
                  ((string *)&local_110,"EXECUTABLE_OUTPUT_PATH",(allocator *)local_f0);
        cmMakefile::GetSafeDefinition(pcVar4,&local_110);
        std::__cxx11::string::assign((char *)out);
      }
      std::__cxx11::string::~string((string *)&local_110);
      goto LAB_0039758c;
    }
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_f0);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)&local_110,(cmListFileBacktrace *)local_f0);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_f0);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_f0,(char *)&local_110);
    local_118.x_ = (cmCompiledGeneratorExpression *)local_f0._0_8_;
    local_f0._0_8_ = (cmState *)0x0;
    cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_f0);
    local_f0._0_8_ = local_f0 + 0x10;
    local_f0._8_8_ = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
    local_f0[0x10] = '\0';
    cmCompiledGeneratorExpression::Evaluate
              (local_118.x_,this->LocalGenerator,config,false,(cmGeneratorTarget *)0x0,
               (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,(string *)local_f0);
    std::__cxx11::string::assign((char *)out);
    std::__cxx11::string::~string((string *)local_f0);
    bVar5 = std::operator!=(out,pcVar7);
    if (bVar5) {
      std::__cxx11::string::assign((char *)&local_d0);
    }
  }
  else {
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_f0);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)&local_110,(cmListFileBacktrace *)local_f0);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_f0);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_f0,(char *)&local_110);
    local_118.x_ = (cmCompiledGeneratorExpression *)local_f0._0_8_;
    local_f0._0_8_ = (cmState *)0x0;
    cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_f0);
    local_f0._0_8_ = local_f0 + 0x10;
    local_f0._8_8_ = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
    local_f0[0x10] = '\0';
    cmCompiledGeneratorExpression::Evaluate
              (local_118.x_,this->LocalGenerator,config,false,(cmGeneratorTarget *)0x0,
               (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,(string *)local_f0);
    std::__cxx11::string::assign((char *)out);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::assign((char *)&local_d0);
  }
  cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_118);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&local_110);
LAB_0039758c:
  sVar2 = out->_M_string_length;
  if (sVar2 == 0) {
    std::__cxx11::string::assign((char *)out);
  }
  pcVar7 = cmLocalGenerator::GetCurrentBinaryDirectory(this->LocalGenerator);
  cmsys::SystemTools::CollapseFullPath(&local_110,out,pcVar7);
  std::__cxx11::string::operator=((string *)out,(string *)&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  if (local_d0._M_string_length != 0) {
    iVar6 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x23])
                      (this->GlobalGenerator,this->Makefile);
    pcVar7 = "${EFFECTIVE_PLATFORM_NAME}";
    if ((char)iVar6 == '\0') {
      pcVar7 = "";
    }
    if (sVar2 != 0) {
      pcVar7 = "";
    }
    std::__cxx11::string::string((string *)&local_110,pcVar7,(allocator *)local_f0);
    pcVar3 = this->LocalGenerator->GlobalGenerator;
    std::__cxx11::string::string((string *)local_f0,"/",(allocator *)&local_118);
    (*pcVar3->_vptr_cmGlobalGenerator[0x12])(pcVar3,local_f0,&local_d0,&local_110,out);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)&local_110);
  }
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)&local_d0);
  return sVar2 == 0;
}

Assistant:

bool cmGeneratorTarget::ComputeOutputDir(const std::string& config,
                                         cmStateEnums::ArtifactType artifact,
                                         std::string& out) const
{
  bool usesDefaultOutputDir = false;
  std::string conf = config;

  // Look for a target property defining the target output directory
  // based on the target type.
  std::string targetTypeName = this->GetOutputTargetType(artifact);
  const char* propertyName = CM_NULLPTR;
  std::string propertyNameStr = targetTypeName;
  if (!propertyNameStr.empty()) {
    propertyNameStr += "_OUTPUT_DIRECTORY";
    propertyName = propertyNameStr.c_str();
  }

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  const char* configProp = CM_NULLPTR;
  std::string configPropStr = targetTypeName;
  if (!configPropStr.empty()) {
    configPropStr += "_OUTPUT_DIRECTORY_";
    configPropStr += configUpper;
    configProp = configPropStr.c_str();
  }

  // Select an output directory.
  if (const char* config_outdir = this->GetProperty(configProp)) {
    // Use the user-specified per-configuration output directory.
    cmGeneratorExpression ge;
    CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(config_outdir);
    out = cge->Evaluate(this->LocalGenerator, config);

    // Skip per-configuration subdirectory.
    conf = "";
  } else if (const char* outdir = this->GetProperty(propertyName)) {
    // Use the user-specified output directory.
    cmGeneratorExpression ge;
    CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(outdir);
    out = cge->Evaluate(this->LocalGenerator, config);

    // Skip per-configuration subdirectory if the value contained a
    // generator expression.
    if (out != outdir) {
      conf = "";
    }
  } else if (this->GetType() == cmStateEnums::EXECUTABLE) {
    // Lookup the output path for executables.
    out = this->Makefile->GetSafeDefinition("EXECUTABLE_OUTPUT_PATH");
  } else if (this->GetType() == cmStateEnums::STATIC_LIBRARY ||
             this->GetType() == cmStateEnums::SHARED_LIBRARY ||
             this->GetType() == cmStateEnums::MODULE_LIBRARY) {
    // Lookup the output path for libraries.
    out = this->Makefile->GetSafeDefinition("LIBRARY_OUTPUT_PATH");
  }
  if (out.empty()) {
    // Default to the current output directory.
    usesDefaultOutputDir = true;
    out = ".";
  }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath(
    out, this->LocalGenerator->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if (!conf.empty()) {
    bool useEPN =
      this->GlobalGenerator->UseEffectivePlatformName(this->Makefile);
    std::string suffix =
      usesDefaultOutputDir && useEPN ? "${EFFECTIVE_PLATFORM_NAME}" : "";
    this->LocalGenerator->GetGlobalGenerator()->AppendDirectoryForConfig(
      "/", conf, suffix, out);
  }

  return usesDefaultOutputDir;
}